

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool __thiscall
GenericTransactionSignatureChecker<CMutableTransaction>::CheckLockTime
          (GenericTransactionSignatureChecker<CMutableTransaction> *this,CScriptNum *nLockTime)

{
  long lVar1;
  bool bVar2;
  const_reference pvVar3;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_RSI;
  int64_t *in_RDI;
  long in_FS_OFFSET;
  bool local_42;
  bool local_41;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(uint *)(in_RDI[1] + 0x34) < 500000000) {
    bVar2 = CScriptNum::operator<((CScriptNum *)in_RSI,in_RDI);
    local_41 = true;
    if (bVar2) goto LAB_008bb808;
  }
  local_42 = false;
  if (499999999 < *(uint *)(in_RDI[1] + 0x34)) {
    local_42 = CScriptNum::operator>=((CScriptNum *)in_RSI,in_RDI);
  }
  local_41 = local_42;
LAB_008bb808:
  if (((local_41 ^ 0xffU) & 1) == 0) {
    bVar2 = CScriptNum::operator>((CScriptNum *)in_RSI,in_RDI);
    if (bVar2) {
      local_21 = false;
    }
    else {
      pvVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[](in_RSI,(size_type)in_RDI);
      if (pvVar3->nSequence == 0xffffffff) {
        local_21 = false;
      }
      else {
        local_21 = true;
      }
    }
  }
  else {
    local_21 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckLockTime(const CScriptNum& nLockTime) const
{
    // There are two kinds of nLockTime: lock-by-blockheight
    // and lock-by-blocktime, distinguished by whether
    // nLockTime < LOCKTIME_THRESHOLD.
    //
    // We want to compare apples to apples, so fail the script
    // unless the type of nLockTime being tested is the same as
    // the nLockTime in the transaction.
    if (!(
        (txTo->nLockTime <  LOCKTIME_THRESHOLD && nLockTime <  LOCKTIME_THRESHOLD) ||
        (txTo->nLockTime >= LOCKTIME_THRESHOLD && nLockTime >= LOCKTIME_THRESHOLD)
    ))
        return false;

    // Now that we know we're comparing apples-to-apples, the
    // comparison is a simple numeric one.
    if (nLockTime > (int64_t)txTo->nLockTime)
        return false;

    // Finally the nLockTime feature can be disabled in IsFinalTx()
    // and thus CHECKLOCKTIMEVERIFY bypassed if every txin has
    // been finalized by setting nSequence to maxint. The
    // transaction would be allowed into the blockchain, making
    // the opcode ineffective.
    //
    // Testing if this vin is not final is sufficient to
    // prevent this condition. Alternatively we could test all
    // inputs, but testing just this input minimizes the data
    // required to prove correct CHECKLOCKTIMEVERIFY execution.
    if (CTxIn::SEQUENCE_FINAL == txTo->vin[nIn].nSequence)
        return false;

    return true;
}